

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_> *
__thiscall
Catch::clara::detail::Parser::getHelpColumns
          (vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
           *__return_storage_ptr__,Parser *this)

{
  pointer pOVar1;
  pointer this_00;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  childCols;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pOVar1 = (this->m_options).
           super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_options).
                 super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pOVar1; this_00 = this_00 + 1
      ) {
    Opt::getHelpColumns(&local_38,this_00);
    ::std::
    vector<Catch::clara::detail::HelpColumns,std::allocator<Catch::clara::detail::HelpColumns>>::
    insert<__gnu_cxx::__normal_iterator<Catch::clara::detail::HelpColumns*,std::vector<Catch::clara::detail::HelpColumns,std::allocator<Catch::clara::detail::HelpColumns>>>,void>
              ((vector<Catch::clara::detail::HelpColumns,std::allocator<Catch::clara::detail::HelpColumns>>
                *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
                )local_38.
                 super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
                )local_38.
                 super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>::
    ~vector(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

auto getHelpColumns() const -> std::vector<HelpColumns> {
            std::vector<HelpColumns> cols;
            for (auto const &o : m_options) {
                auto childCols = o.getHelpColumns();
                cols.insert( cols.end(), childCols.begin(), childCols.end() );
            }
            return cols;
        }